

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkServerTest.cpp
# Opt level: O2

void __thiscall
MyServerConnection::OnData(MyServerConnection *this,uint32_t channel,uint8_t *data,uint32_t bytes)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  byte bVar2;
  uint32_t uVar3;
  MyServerConnection *this_01;
  uint3 uVar4;
  bool bVar5;
  OutputWorker *pOVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  TonkStatus *this_02;
  shared_ptr<MyServerConnection> *connection;
  pointer psVar10;
  SDKResult result;
  TonkStatus statusBob;
  TonkStatus status;
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  connections;
  TonkStatus statusAlice;
  uint8_t msg [1400];
  
  if (bytes == 0) {
    return;
  }
  bVar2 = *data;
  switch(bVar2) {
  case 2:
    this->P2PRequested = true;
    tonk::SDKConnection::GetStatus(&statusBob,&this->super_SDKConnection);
    tonk::SDKConnectionList<MyServerConnection>::GetList(&connections,&this->Server->ConnectionList)
    ;
    poVar1 = (ostringstream *)(msg + 0x10);
    this_00 = (ostringstream *)(msg + 0x10);
    for (psVar10 = connections.
                   super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        psVar10 !=
        connections.
        super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; psVar10 = psVar10 + 1) {
      this_01 = (psVar10->super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      if ((this_01 != this) && (this_01->P2PRequested == true)) {
        tonk::SDKConnection::GetStatus(&statusAlice,&this_01->super_SDKConnection);
        if ((int)Logger.ChannelMinLevel < 3) {
          msg._0_8_ = Logger.ChannelName;
          msg[8] = '\x02';
          msg[9] = '\0';
          msg[10] = '\0';
          msg[0xb] = '\0';
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
          std::operator<<((ostream *)poVar1,"Connecting Alice(");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<((ostream *)poVar1,") and Bob(");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<((ostream *)poVar1,")");
          pOVar6 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)msg);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
        }
        result = tonk::SDKConnection::P2PConnect
                           (&this->super_SDKConnection,
                            &((psVar10->
                              super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->super_SDKConnection);
        if (result.Result != Tonk_Success) break;
        tonk::SDKResult::ToString_abi_cxx11_((string *)&status,&result);
        if ((int)Logger.ChannelMinLevel < 5) {
          msg._0_8_ = Logger.ChannelName;
          msg[8] = '\x04';
          msg[9] = '\0';
          msg[10] = '\0';
          msg[0xb] = '\0';
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::operator<<((ostream *)this_00,(string *)&Logger.Prefix);
          std::operator<<((ostream *)this_00,"P2PConnect failed: ");
          std::operator<<((ostream *)this_00,(string *)&status);
          pOVar6 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)msg);
          std::__cxx11::ostringstream::~ostringstream(this_00);
        }
        std::__cxx11::string::~string((string *)&status);
      }
    }
    this_02 = (TonkStatus *)&connections;
    break;
  case 5:
    tonk::SDKConnection::GetStatus(&status,&this->super_SDKConnection);
    if ((int)Logger.ChannelMinLevel < 3) {
      poVar1 = (ostringstream *)(msg + 0x10);
      msg._0_8_ = Logger.ChannelName;
      msg[8] = '\x02';
      msg[9] = '\0';
      msg[10] = '\0';
      msg[0xb] = '\0';
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
      std::operator<<((ostream *)poVar1,"Rebroadcast request from ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1," : \'");
      std::operator<<((ostream *)poVar1,(char *)(data + 1));
      std::operator<<((ostream *)poVar1,"\'");
      pOVar6 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)msg);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
    msg[1] = (undefined1)status.LocallyAssignedIdForRemoteHost;
    msg[2] = status.LocallyAssignedIdForRemoteHost._1_1_;
    msg[3] = status.LocallyAssignedIdForRemoteHost._2_1_;
    msg[4] = status.LocallyAssignedIdForRemoteHost._3_1_;
    msg[0] = '\x05';
    memcpy(msg + 4,data + 1,(ulong)(bytes - 1));
    tonk::SDKConnectionList<MyServerConnection>::GetList
              ((vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
                *)&statusBob,&this->Server->ConnectionList);
    for (; statusBob._0_8_ != statusBob._8_8_; statusBob._0_8_ = statusBob._0_8_ + 0x10) {
      if (*(MyServerConnection **)statusBob._0_8_ != this) {
        tonk::SDKConnection::Send
                  (&(*(MyServerConnection **)statusBob._0_8_)->super_SDKConnection,msg,
                   (ulong)(bytes + 4),0x33);
      }
    }
    this_02 = &statusBob;
    break;
  case 6:
    if ((int)Logger.ChannelMinLevel < 2) {
      poVar1 = (ostringstream *)(msg + 0x10);
      msg._0_8_ = Logger.ChannelName;
      msg[8] = '\x01';
      msg[9] = '\0';
      msg[10] = '\0';
      msg[0xb] = '\0';
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
      std::operator<<((ostream *)poVar1,"Got pre-connect data test");
      pOVar6 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)msg);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
    bVar5 = test::ValidatePreconnectData(channel,data,bytes);
    if (bVar5) {
      return;
    }
    if (4 < (int)Logger.ChannelMinLevel) {
      return;
    }
    poVar1 = (ostringstream *)(msg + 0x10);
    msg._0_8_ = Logger.ChannelName;
    msg[8] = '\x04';
    msg[9] = '\0';
    msg[10] = '\0';
    msg[0xb] = '\0';
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
    std::operator<<((ostream *)poVar1,"ERROR: Preconnect data was invalid!");
    pOVar6 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)msg);
LAB_00103f29:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(msg + 0x10));
    return;
  case 7:
    if ((int)Logger.ChannelMinLevel < 5 && *(int3 *)(data + 6) != -0x522ed3) {
      poVar1 = (ostringstream *)(msg + 0x10);
      msg._0_8_ = Logger.ChannelName;
      msg[8] = '\x04';
      msg[9] = '\0';
      msg[10] = '\0';
      msg[0xb] = '\0';
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
      std::operator<<((ostream *)poVar1,"Corrupted data: Bad magic");
      pOVar6 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)msg);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
    uVar3 = *(uint32_t *)(data + 9);
    if ((this->NextPacketIndex != uVar3) && ((int)Logger.ChannelMinLevel < 5)) {
      poVar1 = (ostringstream *)(msg + 0x10);
      msg._0_8_ = Logger.ChannelName;
      msg[8] = '\x04';
      msg[9] = '\0';
      msg[10] = '\0';
      msg[0xb] = '\0';
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
      std::operator<<((ostream *)poVar1,"Corrupted data: Incorrect packet id");
      pOVar6 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)msg);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
    this->NextPacketIndex = uVar3 + 1;
    return;
  case 8:
    if ((channel != 0x98) && ((int)Logger.ChannelMinLevel < 5)) {
      poVar1 = (ostringstream *)(msg + 0x10);
      msg._0_8_ = Logger.ChannelName;
      msg[8] = '\x04';
      msg[9] = '\0';
      msg[10] = '\0';
      msg[0xb] = '\0';
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
      std::operator<<((ostream *)poVar1,"Corrupted data: Wrong channel");
      pOVar6 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)msg);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
    uVar4 = *(uint3 *)(data + 3);
    uVar7 = tonk::SDKConnection::FromLocalTime16(&this->super_SDKConnection,*(uint16_t *)(data + 1))
    ;
    uVar8 = tonk::SDKConnection::FromLocalTime23(&this->super_SDKConnection,(uint)uVar4);
    if ((int)Logger.ChannelMinLevel < 5 && *(int3 *)(data + 6) != -0x522ed3) {
      poVar1 = (ostringstream *)(msg + 0x10);
      msg._0_8_ = Logger.ChannelName;
      msg[8] = '\x04';
      msg[9] = '\0';
      msg[10] = '\0';
      msg[0xb] = '\0';
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
      std::operator<<((ostream *)poVar1,"Corrupted data: Bad magic");
      pOVar6 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)msg);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
    uVar3 = *(uint32_t *)(data + 9);
    if ((this->NextPacketIndex != uVar3) && ((int)Logger.ChannelMinLevel < 5)) {
      poVar1 = (ostringstream *)(msg + 0x10);
      msg._0_8_ = Logger.ChannelName;
      msg[8] = '\x04';
      msg[9] = '\0';
      msg[10] = '\0';
      msg[0xb] = '\0';
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
      std::operator<<((ostream *)poVar1,"Corrupted data: Incorrect packet id");
      pOVar6 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)msg);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
    this->NextPacketIndex = uVar3 + 1;
    tonk::SDKConnection::GetStatus((TonkStatus *)msg,&this->super_SDKConnection);
    if ((msg._0_8_ & 1) == 0) {
      return;
    }
    uVar9 = tonk_time();
    test::OWDTimeStatistics::AddSample(&this->OWDStats,uVar9 - uVar8);
    if (uVar9 - this->LastStatsUsec < 2000000) {
      return;
    }
    this->LastStatsUsec = uVar9;
    if ((int)Logger.ChannelMinLevel < 3) {
      poVar1 = (ostringstream *)(msg + 0x10);
      msg._0_8_ = Logger.ChannelName;
      msg[8] = '\x02';
      msg[9] = '\0';
      msg[10] = '\0';
      msg[0xb] = '\0';
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
      std::operator<<((ostream *)poVar1,"DATA RESULT: Transmission time (acc=16) = ");
      std::ostream::operator<<((ostream *)poVar1,(int)uVar9 - (int)uVar7);
      std::operator<<((ostream *)poVar1,", (acc=23) = ");
      std::ostream::operator<<((ostream *)poVar1,(int)(uVar9 - uVar8));
      std::operator<<((ostream *)poVar1," # ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      pOVar6 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)msg);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
    test::OWDTimeStatistics::PrintStatistics(&this->OWDStats);
    return;
  default:
    if (bVar2 == 200) {
      return;
    }
  case 3:
  case 4:
    if (4 < (int)Logger.ChannelMinLevel) {
      return;
    }
    poVar1 = (ostringstream *)(msg + 0x10);
    msg._0_8_ = Logger.ChannelName;
    msg[8] = '\x04';
    msg[9] = '\0';
    msg[10] = '\0';
    msg[0xb] = '\0';
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
    std::operator<<((ostream *)poVar1,"MyServerConnection: Got ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1," bytes of message data unexpected type ");
    std::ostream::operator<<((ostream *)poVar1,(uint)bVar2);
    pOVar6 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)msg);
    goto LAB_00103f29;
  }
  std::
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  ::~vector((vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
             *)this_02);
  return;
}

Assistant:

void MyServerConnection::OnData(
    uint32_t          channel,  // Channel number attached to each message by sender
    const uint8_t*       data,  // Pointer to a buffer containing the message data
    uint32_t            bytes   // Number of bytes in the message
)
{
    if (bytes <= 0) {
        return;
    }

    if (data[0] == 200)
    {
        static uint8_t expected = 0;
        ++expected;
        if (data[1] != expected)
        {
            //Logger.Info("UNORDERED: ", (int)data[1]);
            expected = data[1];
        }
        return;
    }

    if (data[0] == ID_LowPriBulkData_NoTimestamp)
    {
        TONK_CPP_SDK_DEBUG_ASSERT(channel == kLowPriBulkData_Channel);
        TONK_CPP_SDK_DEBUG_ASSERT(bytes == kLowPriBulkData_Bytes);
        uint32_t magic = tonk::ReadU24_LE(data + 1 + 2 + 3);
        if (magic != kLowPriBulkMagic) {
            Logger.Error("Corrupted data: Bad magic");
        }
        TONK_CPP_SDK_DEBUG_ASSERT(magic == kLowPriBulkMagic);
        uint32_t packetIndex = tonk::ReadU32_LE(data + 1 + 2 + 3 + 3);
        TONK_CPP_SDK_DEBUG_ASSERT(NextPacketIndex == packetIndex);
        if (NextPacketIndex != packetIndex) {
            Logger.Error("Corrupted data: Incorrect packet id");
        }
        NextPacketIndex = packetIndex + 1;
        for (unsigned i = 1 + 2 + 3 + 3 + 4; i < bytes; ++i) {
            TONK_CPP_SDK_DEBUG_ASSERT(data[i] == (uint8_t)i);
        }

        return;
    }

    if (data[0] == ID_LowPriBulkData_HasTimestamp)
    {
        TONK_CPP_SDK_DEBUG_ASSERT(channel == kLowPriBulkData_Channel);
        if (channel != kLowPriBulkData_Channel) {
            Logger.Error("Corrupted data: Wrong channel");
        }
        TONK_CPP_SDK_DEBUG_ASSERT(bytes == kLowPriBulkData_Bytes);
        uint16_t ts16 = tonk::ReadU16_LE(data + 1);
        uint32_t ts23 = tonk::ReadU24_LE(data + 1 + 2);
        uint64_t lo16 = FromLocalTime16(ts16);
        uint64_t lo23 = FromLocalTime23(ts23);
        uint32_t magic = tonk::ReadU24_LE(data + 1 + 2 + 3);
        if (magic != kLowPriBulkMagic) {
            Logger.Error("Corrupted data: Bad magic");
        }
        TONK_CPP_SDK_DEBUG_ASSERT(magic == kLowPriBulkMagic);
        uint32_t packetIndex = tonk::ReadU32_LE(data + 1 + 2 + 3 + 3);
        TONK_CPP_SDK_DEBUG_ASSERT(NextPacketIndex == packetIndex);
        if (NextPacketIndex != packetIndex) {
            Logger.Error("Corrupted data: Incorrect packet id");
        }
        NextPacketIndex = packetIndex + 1;
        for (unsigned i = 1 + 2 + 3 + 3 + 4; i < bytes; ++i)
        {
            TONK_CPP_SDK_DEBUG_ASSERT(data[i] == (uint8_t)i);
        }

        if (0 != (GetStatus().Flags & TonkFlag_TimeSync))
        {
            uint64_t nowUsec = tonk_time();
            uint64_t owdUsec = nowUsec - lo23;
            OWDStats.AddSample(owdUsec);

            if (nowUsec - LastStatsUsec >= kStatsReportIntervalUsec)
            {
                LastStatsUsec = nowUsec;
                Logger.Info("DATA RESULT: Transmission time (acc=16) = ", (int)(nowUsec - lo16), ", (acc=23) = ", (int)(nowUsec - lo23), " # ", packetIndex);
                OWDStats.PrintStatistics();
            }
        }

        return;
    }
    if (data[0] == ID_P2PConnectionStart)
    {
        P2PRequested = true;

        TonkStatus statusBob = GetStatus();

        auto connections = Server->ConnectionList.GetList();
        for (auto& connection : connections)
        {
            // If there is a second connection that also requested P2P:
            if (connection.get() != this && connection->P2PRequested)
            {
                TonkStatus statusAlice = connection->GetStatus();

                Logger.Info("Connecting Alice(", statusAlice.LocallyAssignedIdForRemoteHost,
                    ") and Bob(", statusBob.LocallyAssignedIdForRemoteHost, ")");

                tonk::SDKResult result = this->P2PConnect(connection.get());
                if (result)
                {
                    Logger.Error("P2PConnect failed: ", result.ToString());
                    continue;
                }

                break;
            }
        }
        return;
    }
    if (data[0] == ID_ConnectionRebroadcast)
    {
        TonkStatus status = GetStatus();

        const char* str = (char*)data + 1;
        Logger.Info("Rebroadcast request from ", status.LocallyAssignedIdForRemoteHost, " : '", str, "'");

        uint8_t msg[1400];
        msg[0] = ID_ConnectionRebroadcast;
        tonk::WriteU24_LE_Min4Bytes(msg + 1, status.LocallyAssignedIdForRemoteHost);
        memcpy(msg + 1 + 3, data + 1, bytes - 1);

        auto connections = Server->ConnectionList.GetList();
        for (auto& connection : connections)
        {
            // If there is a second connection that also requested P2P:
            if (connection.get() != this) {
                connection->Send(msg, 1 + 3 + bytes, TonkChannel_Reliable0 + 1);
            }
        }
        return;
    }
    if (data[0] == ID_PreConnectDataTest)
    {
        Logger.Debug("Got pre-connect data test");

        const bool validated = ValidatePreconnectData(channel, data, bytes);

        if (!validated)
        {
            Logger.Error("ERROR: Preconnect data was invalid!");
            TONK_CPP_SDK_DEBUG_BREAK();
        }
        return;
    }

    Logger.Error("MyServerConnection: Got ", bytes, " bytes of message data unexpected type ", (int)data[0]);
    TONK_CPP_SDK_DEBUG_BREAK();
}